

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::PairwiseRankLoss::forward_impl
          (PairwiseRankLoss *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  float fVar1;
  pointer ppTVar2;
  Tensor *pTVar3;
  Tensor *pTVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  Index size;
  ulong uVar13;
  float fVar14;
  
  ppTVar2 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar3 = *ppTVar2;
  uVar10 = (ulong)(pTVar3->d).nd;
  iVar8 = 1;
  iVar11 = 1;
  if (uVar10 != 0) {
    uVar13 = 0;
    do {
      iVar11 = iVar11 * (pTVar3->d).d[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
  }
  pTVar4 = ppTVar2[1];
  uVar10 = (ulong)(pTVar4->d).nd;
  if (uVar10 != 0) {
    iVar8 = 1;
    uVar13 = 0;
    do {
      iVar8 = iVar8 * (pTVar4->d).d[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
  }
  uVar9 = iVar8 * (pTVar4->d).bd;
  if (iVar11 * (pTVar3->d).bd == uVar9) {
    uVar10 = (ulong)(fx->d).nd;
    iVar8 = 1;
    if (uVar10 != 0) {
      uVar13 = 0;
      do {
        iVar8 = iVar8 * (fx->d).d[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
    uVar12 = iVar8 * (fx->d).bd;
    if (uVar12 == uVar9) {
      if ((ulong)uVar12 != 0) {
        pfVar5 = pTVar3->v;
        pfVar6 = pTVar4->v;
        fVar1 = this->margin;
        pfVar7 = fx->v;
        uVar10 = 0;
        do {
          fVar14 = (fVar1 - pfVar5[uVar10]) + pfVar6[uVar10];
          if (fVar14 <= 0.0) {
            fVar14 = 0.0;
          }
          pfVar7[uVar10] = fVar14;
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      return;
    }
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<cnn::FPairwiseRankLoss, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::FPairwiseRankLoss, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void PairwiseRankLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#if HAVE_CUDA
  gpu::vpairwise_rank_loss(fx.d.size(), margin, xs[0]->v, xs[1]->v, fx.v);
#else
  auto a = xs[0]->vec();
  auto b = xs[1]->vec();
  fx.vec() = a.binaryExpr(b, FPairwiseRankLoss(margin));
#endif
}